

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O1

Vec_Int_t * Exp_Reverse(Vec_Int_t *p)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = p->nSize;
  if (1 < iVar5) {
    piVar2 = p->pArray;
    iVar3 = -1;
    lVar4 = 0;
    do {
      iVar1 = piVar2[lVar4];
      piVar2[lVar4] = piVar2[iVar5 + iVar3];
      piVar2[p->nSize + iVar3] = iVar1;
      lVar4 = lVar4 + 1;
      iVar5 = p->nSize;
      iVar3 = iVar3 + -1;
    } while (lVar4 < iVar5 / 2);
  }
  return p;
}

Assistant:

static inline Vec_Int_t * Exp_Reverse( Vec_Int_t * p )
{
    Vec_IntReverseOrder( p );
    return p;
}